

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Saig_RefMan_t * Saig_RefManStart(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  Saig_RefMan_t *pSVar1;
  Aig_Man_t *pAVar2;
  
  pSVar1 = (Saig_RefMan_t *)calloc(1,0x28);
  pSVar1->pAig = pAig;
  pSVar1->pCex = pCex;
  pSVar1->nInputs = nInputs;
  pSVar1->fVerbose = fVerbose;
  pAVar2 = Saig_ManUnrollWithCex(pAig,pCex,nInputs,&pSVar1->vMapPiF2A);
  pSVar1->pFrames = pAVar2;
  return pSVar1;
}

Assistant:

Saig_RefMan_t * Saig_RefManStart( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    Saig_RefMan_t * p;
    p = ABC_CALLOC( Saig_RefMan_t, 1 );
    p->pAig = pAig;
    p->pCex = pCex;
    p->nInputs = nInputs;
    p->fVerbose = fVerbose;
    p->pFrames = Saig_ManUnrollWithCex( pAig, pCex, nInputs, &p->vMapPiF2A );
    return p;
}